

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-virt.c
# Opt level: O1

char * string_make(char *str)

{
  size_t sVar1;
  char *buf;
  
  if (str == (char *)0x0) {
    buf = (char *)0x0;
  }
  else {
    sVar1 = strlen(str);
    buf = (char *)mem_alloc(sVar1 + 1);
    my_strcpy(buf,str,sVar1 + 1);
  }
  return buf;
}

Assistant:

char *string_make(const char *str)
{
	char *res;
	size_t siz;

	/* Error-checking */
	if (!str) return NULL;

	/* Allocate space for the string (including terminator) */
	siz = strlen(str) + 1;
	res = mem_alloc(siz);

	/* Copy the string (with terminator) */
	my_strcpy(res, str, siz);

	return res;
}